

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::intEqualsAfterUintCast
               (deInt32 value,deUint32 casted,Precision precision)

{
  deUint32 dVar1;
  uint local_34;
  int local_2c;
  deUint32 signBits;
  int signedIntegerLength;
  deUint32 preciseMask;
  int numPreciseBits;
  int signBitOn;
  deUint32 reference;
  Precision precision_local;
  deUint32 casted_local;
  deInt32 value_local;
  
  local_2c = getPrecisionNumIntegerBits(precision);
  dVar1 = getPrecisionMask(local_2c);
  if ((value & dVar1) == (casted & dVar1)) {
    for (; local_2c < 0x21; local_2c = local_2c + 1) {
      if (value < 0) {
        local_34 = getPrecisionMask(local_2c);
      }
      else {
        local_34 = 0;
      }
      if ((local_34 & (dVar1 ^ 0xffffffff)) == (casted & (dVar1 ^ 0xffffffff))) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool intEqualsAfterUintCast (deInt32 value, deUint32 casted, glu::Precision precision)
{
	// Bit format of 'casted' = [ uint -> highp uint promotion bits (0) ] [ sign extend bits (s) ] [ value bits ]
	//                                                                                             |--min len---|
	//                                                                    |---------------signed length---------|
	//                          |-------------------------------- highp uint length ----------------------------|

	const deUint32	reference		= (deUint32)value;
	const int		signBitOn		= value < 0;
	const int		numPreciseBits	= getPrecisionNumIntegerBits(precision);
	const deUint32	preciseMask		= getPrecisionMask(numPreciseBits);

	// Lowest N bits must match, N = minimum precision
	if ((reference & preciseMask) != (casted & preciseMask))
		return false;

	// Other lowest bits must match the sign and the remaining (topmost) if any must be 0
	for (int signedIntegerLength = numPreciseBits; signedIntegerLength <= 32; ++signedIntegerLength)
	{
		const deUint32 signBits = (signBitOn) ? (getPrecisionMask(signedIntegerLength)) : (0u);

		if ((signBits & ~preciseMask) == (casted & ~preciseMask))
			return true;
	}
	return false;
}